

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.cxx
# Opt level: O1

int __thiscall cm::uv_loop_ptr::init(uv_loop_ptr *this,EVP_PKEY_CTX *ctx)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uv_loop_t *loop;
  int iVar1;
  void *pvVar2;
  
  this_00 = (this->loop).super___shared_ptr<uv_loop_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->loop).super___shared_ptr<uv_loop_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->loop).super___shared_ptr<uv_loop_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pvVar2 = calloc(1,0x350);
  std::__shared_ptr<uv_loop_s,(__gnu_cxx::_Lock_policy)2>::reset<uv_loop_s,cm::uv_loop_deleter>
            ((__shared_ptr<uv_loop_s,(__gnu_cxx::_Lock_policy)2> *)this,pvVar2);
  loop = (this->loop).super___shared_ptr<uv_loop_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  loop->data = ctx;
  iVar1 = uv_loop_init(loop);
  return iVar1;
}

Assistant:

int uv_loop_ptr::init(void* data)
{
  this->reset();

  this->loop.reset(static_cast<uv_loop_t*>(calloc(1, sizeof(uv_loop_t))),
                   uv_loop_deleter());
  this->loop->data = data;

  return uv_loop_init(this->loop.get());
}